

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::LJoint::Solve(LJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  Body *this_01;
  float fVar1;
  btVector3 bVar2;
  btVector3 bVar3;
  float local_c8;
  float local_b8;
  float fStack_b4;
  btVector3 local_90;
  Impulse local_80;
  Impulse local_58;
  
  this_00 = (this->super_Joint).m_bodies;
  bVar2 = Body::velocity(this_00,this->m_rpos);
  this_01 = (this->super_Joint).m_bodies + 1;
  bVar3 = Body::velocity(this_01,this->m_rpos + 1);
  local_c8 = bVar2.m_floats[2];
  local_58.m_drift.m_floats[0] = 0.0;
  local_58.m_drift.m_floats[1] = 0.0;
  local_58.m_drift.m_floats[2] = 0.0;
  local_58.m_drift.m_floats[3] = 0.0;
  local_58._32_1_ = 1;
  fVar1 = (this->super_Joint).m_cfm;
  local_b8 = bVar2.m_floats[0];
  fStack_b4 = bVar2.m_floats[1];
  local_90.m_floats[1] = fVar1 * (fStack_b4 - bVar3.m_floats[1]);
  local_90.m_floats[0] = fVar1 * (local_b8 - bVar3.m_floats[0]);
  local_90.m_floats[2] = (local_c8 - bVar3.m_floats[2]) * fVar1;
  local_90.m_floats[3] = 0.0;
  local_80.m_velocity = operator+(&(this->super_Joint).m_drift,&local_90);
  bVar2 = operator*(&(this->super_Joint).m_massmatrix,&local_80.m_velocity);
  local_58.m_velocity.m_floats[1] = sor * bVar2.m_floats[1];
  local_58.m_velocity.m_floats[0] = sor * bVar2.m_floats[0];
  local_58.m_velocity.m_floats[2] = bVar2.m_floats[2] * sor;
  local_58.m_velocity.m_floats[3] = 0.0;
  Impulse::operator-(&local_80,&local_58);
  Body::applyImpulse(this_00,&local_80,this->m_rpos);
  Body::applyImpulse(this_01,&local_58,this->m_rpos + 1);
  return;
}

Assistant:

void				btSoftBody::LJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vr=va-vb;
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_massmatrix*(m_drift+vr*m_cfm)*sor;
	m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
	m_bodies[1].applyImpulse( impulse,m_rpos[1]);
}